

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.c
# Opt level: O0

ListNode * ListAddAfter(LinkedList *list,void *item,ListNode *bnode)

{
  LISTNODE *pLVar1;
  ListNode *temp;
  ListNode *newNode;
  ListNode *bnode_local;
  void *item_local;
  LinkedList *list_local;
  
  if (list != (LinkedList *)0x0) {
    if ((list == (LinkedList *)0x0) || (bnode == (ListNode *)0x0)) {
      list_local = (LinkedList *)0x0;
    }
    else {
      list_local = (LinkedList *)CreateListNode(item,list);
      if (list_local == (LinkedList *)0x0) {
        list_local = (LinkedList *)0x0;
      }
      else {
        pLVar1 = bnode->next;
        bnode->next = (LISTNODE *)list_local;
        (list_local->head).prev = bnode;
        (list_local->head).next = pLVar1;
        pLVar1->prev = (LISTNODE *)list_local;
        list->size = list->size + 1;
      }
    }
    return &list_local->head;
  }
  __assert_fail("list != NULL",".upnp/src/threadutil/LinkedList.c",0x86,
                "ListNode *ListAddAfter(LinkedList *, void *, ListNode *)");
}

Assistant:

ListNode *ListAddAfter(LinkedList *list, void *item, ListNode *bnode)
{
	ListNode *newNode = NULL;

	assert(list != NULL);

	if (!list || !bnode)
		return NULL;
	newNode = CreateListNode(item, list);
	if (newNode) {
		ListNode *temp = bnode->next;

		bnode->next = newNode;
		newNode->prev = bnode;
		newNode->next = temp;
		temp->prev = newNode;
		list->size++;

		return newNode;
	}

	return NULL;
}